

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorPicker.cpp
# Opt level: O0

Vector3f anon_unknown.dwarf_c0b39::convertHsvToRgb(Vector3f *hsv)

{
  float fVar1;
  Vector3f VVar2;
  float *in_RDI;
  float Y;
  float fVar3;
  double dVar4;
  int hueSection;
  float x;
  float m;
  float chroma;
  Vector3<float> local_c;
  
  fVar3 = in_RDI[1];
  fVar1 = in_RDI[2];
  Y = in_RDI[2] - fVar3 * fVar1;
  dVar4 = std::fmod((double)(ulong)(uint)(*in_RDI * 6.0),5.30498947741318e-315);
  dVar4 = std::fabs((double)CONCAT44((int)((ulong)dVar4 >> 0x20),SUB84(dVar4,0) - 1.0));
  fVar3 = fVar3 * fVar1 * (1.0 - SUB84(dVar4,0));
  switch((int)(*in_RDI * 6.0)) {
  case 0:
    sf::Vector3<float>::Vector3(&local_c,in_RDI[2],fVar3 + Y,Y);
    break;
  case 1:
    sf::Vector3<float>::Vector3(&local_c,fVar3 + Y,in_RDI[2],Y);
    break;
  case 2:
    sf::Vector3<float>::Vector3(&local_c,Y,in_RDI[2],fVar3 + Y);
    break;
  case 3:
    sf::Vector3<float>::Vector3(&local_c,Y,fVar3 + Y,in_RDI[2]);
    break;
  case 4:
    sf::Vector3<float>::Vector3(&local_c,fVar3 + Y,Y,in_RDI[2]);
    break;
  default:
    sf::Vector3<float>::Vector3(&local_c,in_RDI[2],Y,fVar3 + Y);
  }
  VVar2.z = local_c.z;
  VVar2.x = local_c.x;
  VVar2.y = local_c.y;
  return VVar2;
}

Assistant:

sf::Vector3f convertHsvToRgb(const sf::Vector3f& hsv) {
    float chroma = hsv.y * hsv.z;
    float m = hsv.z - chroma;
    float x = chroma * (1.0f - std::fabs(std::fmod(hsv.x * 6.0f, 2.0f) - 1.0f));

    int hueSection = static_cast<int>(hsv.x * 6.0f);
    switch(hueSection) {
    case 0:
        return {hsv.z, x + m, m};
    case 1:
        return {x + m, hsv.z, m};
    case 2:
        return {m, hsv.z, x + m};
    case 3:
        return {m, x + m, hsv.z};
    case 4:
        return {x + m, m, hsv.z};
    default:
        return {hsv.z, m, x + m};
    }
}